

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetFixedStep(void *arkode_mem,sunrealtype hfixed)

{
  undefined4 uVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x50e;
LAB_0013b7a4:
    arkProcessError((ARKodeMem)arkode_mem,error_code,iVar2,"ARKodeSetFixedStep",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
    return error_code;
  }
  if ((hfixed == 0.0) && (!NAN(hfixed))) {
    if (*(int *)((long)arkode_mem + 0x100) == 0) {
      msgfmt = "temporal adaptivity is not supported by this time step module";
      error_code = -0x30;
      iVar2 = 0x517;
      goto LAB_0013b7a4;
    }
    if (*(int *)((long)arkode_mem + 0x54) == 0) {
      if ((*(int *)((long)arkode_mem + 0x18) == 1) &&
         (*(N_Vector *)((long)arkode_mem + 0x30) != (N_Vector)0x0)) {
        iVar2 = ARKodeSVtolerances(arkode_mem,*(sunrealtype *)((long)arkode_mem + 0x20),
                                   *(N_Vector *)((long)arkode_mem + 0x30));
      }
      else {
        iVar2 = ARKodeSStolerances(arkode_mem,*(sunrealtype *)((long)arkode_mem + 0x20),
                                   *(sunrealtype *)((long)arkode_mem + 0x28));
      }
      if (iVar2 != 0) {
        return iVar2;
      }
    }
  }
  if ((hfixed != 0.0) || (NAN(hfixed))) {
    *(sunrealtype *)((long)arkode_mem + 0x2b8) = hfixed;
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
  }
  *(undefined4 *)((long)arkode_mem + 0x300) = uVar1;
  iVar2 = ARKodeSetInitStep(arkode_mem,hfixed);
  return iVar2;
}

Assistant:

int ARKodeSetFixedStep(void* arkode_mem, sunrealtype hfixed)
{
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* ensure that when hfixed=0, the time step module supports adaptivity */
  if ((hfixed == ZERO) && (!ark_mem->step_supports_adaptive))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "temporal adaptivity is not supported by this time step module");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* re-attach internal error weight functions if necessary */
  if ((hfixed == ZERO) && (!ark_mem->user_efun))
  {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
    {
      retval = ARKodeSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    }
    else
    {
      retval = ARKodeSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    }
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* set ark_mem "fixedstep" entry */
  if (hfixed != ZERO)
  {
    ark_mem->fixedstep = SUNTRUE;
    ark_mem->hin       = hfixed;
  }
  else { ark_mem->fixedstep = SUNFALSE; }

  /* Notify ARKODE to use hfixed as the initial step size, and return */
  return ARKodeSetInitStep(arkode_mem, hfixed);
}